

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatMatvec(SUNMatrix A,N_Vector x,N_Vector y,int myid)

{
  int iVar1;
  uint uVar2;
  SUNMatrix A_00;
  undefined8 uVar3;
  undefined8 uVar4;
  uint in_ECX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  SUNMatrix in_RDI;
  sunrealtype tol;
  N_Vector w;
  N_Vector z;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  double local_38;
  double local_30;
  int local_4;
  
  if (in_RDI->ops->matvec == (_func_SUNErrCode_SUNMatrix_N_Vector_N_Vector *)0x0) {
    if ((print_all_ranks == 0) && (in_ECX == 0)) {
      printf("    PASSED test -- SUNMatMatvec not implemented\n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ECX);
      printf("    PASSED test -- SUNMatMatvec not implemented\n");
    }
    return 0;
  }
  iVar1 = is_square((SUNMatrix)&DAT_3d19000000000000);
  if (iVar1 == 0) {
    uVar3 = N_VClone(in_RDX);
    local_30 = get_time();
    uVar2 = SUNMatMatvec(in_RDI,in_RSI,uVar3);
    sync_device(in_RDI);
    local_38 = get_time();
    if (uVar2 != 0) {
      if ((print_all_ranks == 0) && (in_ECX == 0)) {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ECX);
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      }
      return 1;
    }
    iVar1 = check_vector(in_RSI,in_RDX,(sunrealtype)((ulong)in_ECX << 0x20));
    N_VDestroy(uVar3);
  }
  else {
    A_00 = (SUNMatrix)SUNMatClone(in_RDI);
    uVar2 = SUNMatCopy(in_RDI,A_00);
    if (uVar2 != 0) {
      if ((print_all_ranks == 0) && (in_ECX == 0)) {
        printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar2);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ECX);
        printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar2);
      }
      SUNMatDestroy(A_00);
      return 1;
    }
    uVar2 = SUNMatScaleAddI(0x4008000000000000,A_00);
    if (uVar2 != 0) {
      if ((print_all_ranks == 0) && (in_ECX == 0)) {
        printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar2);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ECX);
        printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar2);
      }
      SUNMatDestroy(A_00);
      return 1;
    }
    uVar3 = N_VClone(in_RDX);
    uVar4 = N_VClone(in_RDX);
    if ((A_00->ops->matvecsetup != (_func_SUNErrCode_SUNMatrix *)0x0) &&
       (uVar2 = SUNMatMatvecSetup(A_00), uVar2 != 0)) {
      if ((print_all_ranks == 0) && (in_ECX == 0)) {
        printf(">>> FAILED test -- SUNMatMatvecSetup returned %d \n",(ulong)uVar2);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ECX);
        printf(">>> FAILED test -- SUNMatMatvecSetup returned %d \n",(ulong)uVar2);
      }
      SUNMatDestroy(A_00);
      return 1;
    }
    local_30 = get_time();
    uVar2 = SUNMatMatvec(A_00,in_RSI,uVar3);
    sync_device(A_00);
    local_38 = get_time();
    if (uVar2 != 0) {
      if ((print_all_ranks == 0) && (in_ECX == 0)) {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ECX);
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar2);
      }
      SUNMatDestroy(A_00);
      return 1;
    }
    N_VLinearSum(0x4008000000000000,0x3ff0000000000000,in_RDX,in_RSI,uVar4);
    iVar1 = check_vector(in_RSI,in_RDX,(sunrealtype)CONCAT44(in_ECX,uVar2));
    SUNMatDestroy(A_00);
    N_VDestroy(uVar3);
    N_VDestroy(uVar4);
  }
  if (iVar1 == 0) {
    if ((print_all_ranks == 0) && (in_ECX == 0)) {
      printf("    PASSED test -- SUNMatMatvec \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ECX);
      printf("    PASSED test -- SUNMatMatvec \n");
    }
    if ((in_ECX == 0) && (print_time != 0)) {
      printf("    SUNMatMatvec Time: %22.15e \n \n",local_38 - local_30);
    }
    local_4 = 0;
  }
  else {
    if ((print_all_ranks == 0) && (in_ECX == 0)) {
      printf(">>> FAILED test -- SUNMatMatvec check \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ECX);
      printf(">>> FAILED test -- SUNMatMatvec check \n");
    }
    if (print_time != 0) {
      printf("    SUNMatMatvec Time: %22.15e \n \n",local_38 - local_30);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatMatvec(SUNMatrix A, N_Vector x, N_Vector y, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  N_Vector z, w;
  sunrealtype tol = 100 * SUN_UNIT_ROUNDOFF;

  if (A->ops->matvec == NULL)
  {
    TEST_STATUS("    PASSED test -- SUNMatMatvec not implemented\n", myid);
    return (0);
  }

  /* harder tests for square matrices */
  if (is_square(A))
  {
    /* protect A */
    B       = SUNMatClone(A);
    failure = SUNMatCopy(A, B);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      return (1);
    }

    /* compute matrix vector product */
    failure = SUNMatScaleAddI(THREE, B);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      return (1);
    }

    z = N_VClone(y); /* will be computed with matvec */
    w = N_VClone(y); /* will be the reference */

    /* Call the Setup function before the Matvec if it exists */
    if (B->ops->matvecsetup)
    {
      failure = SUNMatMatvecSetup(B);
      if (failure)
      {
        TEST_STATUS2(">>> FAILED test -- SUNMatMatvecSetup returned %d \n",
                     failure, myid);
        SUNMatDestroy(B);
        return (1);
      }
    }

    start_time = get_time();
    failure    = SUNMatMatvec(B, x, z); /* z = (3A+I)x = 3y + x */
    sync_device(B);
    stop_time = get_time();

    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatMatvec returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      return (1);
    }

    N_VLinearSum(THREE, y, ONE, x, w); /* w = 3y + x */

    failure = check_vector(w, z, tol);

    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
  }
  else
  {
    z = N_VClone(y); /* will be computed with matvec */

    start_time = get_time();
    failure    = SUNMatMatvec(A, x, z); /* z = Ax */
    sync_device(A);
    stop_time = get_time();

    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatMatvec returned %d \n", failure,
                   myid);
      return (1);
    }

    failure = check_vector(y, z, tol);

    N_VDestroy(z);
  }

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatMatvec check \n", myid);
    PRINT_TIME("    SUNMatMatvec Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatMatvec \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatMatvec Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}